

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.cpp
# Opt level: O3

Vector * KDIS::DATA_TYPE::Vector::Lerp
                   (Vector *__return_storage_ptr__,Vector *From,Vector *To,KFLOAT32 T)

{
  undefined4 uVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  KFLOAT32 KVar7;
  Vector *tmp_2;
  float fVar8;
  float fVar9;
  Vector tmp;
  Vector tmp_1;
  DataTypeBase local_40;
  undefined8 local_38;
  float local_30;
  DataTypeBase local_28;
  undefined8 local_20;
  float local_18;
  
  local_40._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00310d80;
  uVar5 = To->m_f32X;
  uVar6 = To->m_f32Y;
  uVar1 = From->m_f32X;
  uVar3 = From->m_f32Y;
  local_38 = CONCAT44((float)uVar6 - (float)uVar3,(float)uVar5 - (float)uVar1);
  local_30 = (float)To->m_f32Z - (float)From->m_f32Z;
  local_28._vptr_DataTypeBase = (_func_int **)&PTR__DataTypeBase_00310d80;
  fVar8 = (float)T * ((float)uVar5 - (float)uVar1);
  fVar9 = (float)T * ((float)uVar6 - (float)uVar3);
  local_20 = CONCAT44(fVar9,fVar8);
  local_18 = (float)T * local_30;
  (__return_storage_ptr__->super_DataTypeBase)._vptr_DataTypeBase =
       (_func_int **)&PTR__DataTypeBase_00310d80;
  KVar7 = From->m_f32Y;
  __return_storage_ptr__->m_f32X = From->m_f32X;
  __return_storage_ptr__->m_f32Y = KVar7;
  __return_storage_ptr__->m_f32Z = From->m_f32Z;
  uVar2 = __return_storage_ptr__->m_f32X;
  uVar4 = __return_storage_ptr__->m_f32Y;
  __return_storage_ptr__->m_f32X = (KFLOAT32)((float)uVar2 + fVar8);
  __return_storage_ptr__->m_f32Y = (KFLOAT32)((float)uVar4 + fVar9);
  __return_storage_ptr__->m_f32Z = (KFLOAT32)(local_18 + (float)__return_storage_ptr__->m_f32Z);
  DataTypeBase::~DataTypeBase(&local_28);
  DataTypeBase::~DataTypeBase(&local_40);
  return __return_storage_ptr__;
}

Assistant:

Vector Vector::Lerp( const Vector & From, const Vector & To, KFLOAT32 T )
{
    return From + ( ( To - From ) * T );
}